

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int alloc_addbyter(int output,FILE *data)

{
  void *pvVar1;
  char *newptr;
  uchar outc;
  asprintf *infop;
  FILE *data_local;
  int output_local;
  
  if (*(long *)data == 0) {
    pvVar1 = (*Curl_cmalloc)(0x20);
    *(void **)data = pvVar1;
    if (*(long *)data == 0) {
      *(undefined4 *)&data->_IO_read_base = 1;
      return -1;
    }
    data->_IO_read_end = (char *)0x20;
    data->_IO_read_ptr = (char *)0x0;
  }
  else if (data->_IO_read_end <= data->_IO_read_ptr + 1) {
    pvVar1 = (*Curl_crealloc)(*(void **)data,(long)data->_IO_read_end << 1);
    if (pvVar1 == (void *)0x0) {
      *(undefined4 *)&data->_IO_read_base = 1;
      return -1;
    }
    *(void **)data = pvVar1;
    data->_IO_read_end = (char *)((long)data->_IO_read_end << 1);
  }
  data->_IO_read_ptr[*(long *)data] = (char)output;
  data->_IO_read_ptr = data->_IO_read_ptr + 1;
  return output & 0xff;
}

Assistant:

static int alloc_addbyter(int output, FILE *data)
{
  struct asprintf *infop=(struct asprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(!infop->buffer) {
    infop->buffer = malloc(32);
    if(!infop->buffer) {
      infop->fail = 1;
      return -1; /* fail */
    }
    infop->alloc = 32;
    infop->len =0;
  }
  else if(infop->len+1 >= infop->alloc) {
    char *newptr;

    newptr = realloc(infop->buffer, infop->alloc*2);

    if(!newptr) {
      infop->fail = 1;
      return -1; /* fail */
    }
    infop->buffer = newptr;
    infop->alloc *= 2;
  }

  infop->buffer[ infop->len ] = outc;

  infop->len++;

  return outc; /* fputc() returns like this on success */
}